

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_process_origin_frame(nghttp2_session *session)

{
  int iVar1;
  int rv;
  nghttp2_mem *mem;
  nghttp2_frame *frame;
  nghttp2_inbound_frame *iframe;
  nghttp2_session *session_local;
  
  session_local._4_4_ =
       nghttp2_frame_unpack_origin_payload
                 ((nghttp2_extension *)&session->iframe,(session->iframe).lbuf.pos,
                  (long)(session->iframe).lbuf.last - (long)(session->iframe).lbuf.pos,&session->mem
                 );
  if (session_local._4_4_ == 0) {
    session_local._4_4_ = nghttp2_session_on_origin_received(session,&(session->iframe).frame);
  }
  else {
    iVar1 = nghttp2_is_fatal(session_local._4_4_);
    if (iVar1 == 0) {
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int session_process_origin_frame(nghttp2_session *session) {
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;
  nghttp2_mem *mem = &session->mem;
  int rv;

  rv = nghttp2_frame_unpack_origin_payload(&frame->ext, iframe->lbuf.pos,
                                           nghttp2_buf_len(&iframe->lbuf), mem);
  if (rv != 0) {
    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
    /* Ignore ORIGIN frame which cannot be parsed. */
    return 0;
  }

  return nghttp2_session_on_origin_received(session, frame);
}